

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetEscapedValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  bool bVar17;
  char *pcVar18;
  TemplateDictionaryPeer peer;
  TemplateString local_2d0;
  DoubleEscaper double_escaper;
  FooEscaper foo_escaper;
  TemplateString local_2a0;
  TemplateDictionary dict;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateString local_b0;
  TemplateString local_90;
  TemplateString local_70;
  TemplateString local_50;
  TemplateString local_30;
  
  ctemplate::TemplateString::TemplateString(&local_2d0,"test_SetEscapedValue");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_2d0,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_30,"hardest HTML");
  ctemplate::TemplateString::TemplateString(&local_50,"<A HREF=\'foo\'\nid=\"bar\t\t&&\vbaz\">");
  TVar1.length_ = local_30.length_;
  TVar1.ptr_ = local_30.ptr_;
  TVar1.is_immutable_ = local_30.is_immutable_;
  TVar1._17_7_ = local_30._17_7_;
  TVar1.id_ = local_30.id_;
  TVar9.length_ = local_50.length_;
  TVar9.ptr_ = local_50.ptr_;
  TVar9.is_immutable_ = local_50.is_immutable_;
  TVar9._17_7_ = local_50._17_7_;
  TVar9.id_ = local_50.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar9,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_70,"hardest JS");
  ctemplate::TemplateString::TemplateString
            (&local_90,"f = \'foo\';\r\n\tprint \"\\&foo = \b\", \"foo\"");
  TVar2.length_ = local_70.length_;
  TVar2.ptr_ = local_70.ptr_;
  TVar2.is_immutable_ = local_70.is_immutable_;
  TVar2._17_7_ = local_70._17_7_;
  TVar2.id_ = local_70.id_;
  TVar10.length_ = local_90.length_;
  TVar10.ptr_ = local_90.ptr_;
  TVar10.is_immutable_ = local_90.is_immutable_;
  TVar10._17_7_ = local_90._17_7_;
  TVar10.id_ = local_90.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar10,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_b0,"query escape 0");
  ctemplate::TemplateString::TemplateString(&local_d0,"");
  TVar3.length_ = local_b0.length_;
  TVar3.ptr_ = local_b0.ptr_;
  TVar3.is_immutable_ = local_b0.is_immutable_;
  TVar3._17_7_ = local_b0._17_7_;
  TVar3.id_ = local_b0.id_;
  TVar11.length_ = local_d0.length_;
  TVar11.ptr_ = local_d0.ptr_;
  TVar11.is_immutable_ = local_d0.is_immutable_;
  TVar11._17_7_ = local_d0._17_7_;
  TVar11.id_ = local_d0.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar11,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_2d0,"hardest HTML");
  ctemplate::TemplateString::TemplateString
            (&local_2a0,"&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; baz&quot;&gt;");
  bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
  if (bVar17) {
    ctemplate::TemplateString::TemplateString(&local_2d0,"hardest JS");
    ctemplate::TemplateString::TemplateString
              (&local_2a0,
               "f \\x3d \\x27foo\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo \\x3d \\b\\x22, \\x22foo\\x22"
              );
    bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
    if (bVar17) {
      ctemplate::TemplateString::TemplateString(&local_2d0,"query escape 0");
      ctemplate::TemplateString::TemplateString(&local_2a0,"");
      bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
      if (bVar17) {
        foo_escaper = (FooEscaper)&PTR_Modify_0011ac68;
        ctemplate::TemplateString::TemplateString(&local_f0,"easy foo");
        ctemplate::TemplateString::TemplateString(&local_110,"hello there!");
        local_2d0.ptr_ = (char *)&PTR_Modify_0011ac68;
        TVar4.length_ = local_f0.length_;
        TVar4.ptr_ = local_f0.ptr_;
        TVar4.is_immutable_ = local_f0.is_immutable_;
        TVar4._17_7_ = local_f0._17_7_;
        TVar4.id_ = local_f0.id_;
        TVar12.length_ = local_110.length_;
        TVar12.ptr_ = local_110.ptr_;
        TVar12.is_immutable_ = local_110.is_immutable_;
        TVar12._17_7_ = local_110._17_7_;
        TVar12.id_ = local_110.id_;
        ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar12,(TemplateModifier *)&dict);
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_2d0);
        ctemplate::TemplateString::TemplateString(&local_130,"harder foo");
        ctemplate::TemplateString::TemplateString(&local_150,"so much to say\nso many foos");
        TVar5.length_ = local_130.length_;
        TVar5.ptr_ = local_130.ptr_;
        TVar5.is_immutable_ = local_130.is_immutable_;
        TVar5._17_7_ = local_130._17_7_;
        TVar5.id_ = local_130.id_;
        TVar13.length_ = local_150.length_;
        TVar13.ptr_ = local_150.ptr_;
        TVar13.is_immutable_ = local_150.is_immutable_;
        TVar13._17_7_ = local_150._17_7_;
        TVar13.id_ = local_150.id_;
        ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar13,(TemplateModifier *)&dict);
        double_escaper = (DoubleEscaper)&PTR_Modify_0011acb0;
        ctemplate::TemplateString::TemplateString(&local_170,"easy double");
        ctemplate::TemplateString::TemplateString(&local_190,"doo");
        TVar6.length_ = local_170.length_;
        TVar6.ptr_ = local_170.ptr_;
        TVar6.is_immutable_ = local_170.is_immutable_;
        TVar6._17_7_ = local_170._17_7_;
        TVar6.id_ = local_170.id_;
        TVar14.length_ = local_190.length_;
        TVar14.ptr_ = local_190.ptr_;
        TVar14.is_immutable_ = local_190.is_immutable_;
        TVar14._17_7_ = local_190._17_7_;
        TVar14.id_ = local_190.id_;
        ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar14,(TemplateModifier *)&dict);
        ctemplate::TemplateString::TemplateString(&local_1b0,"harder double");
        ctemplate::TemplateString::TemplateString(&local_1d0,"<A HREF=\'foo\'>\n");
        local_2d0.ptr_ = (char *)&PTR_Modify_0011acb0;
        TVar7.length_ = local_1b0.length_;
        TVar7.ptr_ = local_1b0.ptr_;
        TVar7.is_immutable_ = local_1b0.is_immutable_;
        TVar7._17_7_ = local_1b0._17_7_;
        TVar7.id_ = local_1b0.id_;
        TVar15.length_ = local_1d0.length_;
        TVar15.ptr_ = local_1d0.ptr_;
        TVar15.is_immutable_ = local_1d0.is_immutable_;
        TVar15._17_7_ = local_1d0._17_7_;
        TVar15.id_ = local_1d0.id_;
        ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar15,(TemplateModifier *)&dict);
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_2d0);
        ctemplate::TemplateString::TemplateString(&local_1f0,"hardest double");
        ctemplate::TemplateString::TemplateString(&local_210,"print \"<A HREF=\'foo\'>\";\r\n\\1;");
        TVar8.length_ = local_1f0.length_;
        TVar8.ptr_ = local_1f0.ptr_;
        TVar8.is_immutable_ = local_1f0.is_immutable_;
        TVar8._17_7_ = local_1f0._17_7_;
        TVar8.id_ = local_1f0.id_;
        TVar16.length_ = local_210.length_;
        TVar16.ptr_ = local_210.ptr_;
        TVar16.is_immutable_ = local_210.is_immutable_;
        TVar16._17_7_ = local_210._17_7_;
        TVar16.id_ = local_210.id_;
        ctemplate::TemplateDictionary::SetEscapedValue(TVar8,TVar16,(TemplateModifier *)&dict);
        ctemplate::TemplateString::TemplateString(&local_2d0,"easy foo");
        ctemplate::TemplateString::TemplateString(&local_2a0,"foo");
        bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
        if (bVar17) {
          ctemplate::TemplateString::TemplateString(&local_2d0,"harder foo");
          ctemplate::TemplateString::TemplateString(&local_2a0,"foo");
          bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
          if (bVar17) {
            ctemplate::TemplateString::TemplateString(&local_2d0,"easy double");
            ctemplate::TemplateString::TemplateString(&local_2a0,"doo");
            bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
            if (bVar17) {
              ctemplate::TemplateString::TemplateString(&local_2d0,"harder double");
              ctemplate::TemplateString::TemplateString
                        (&local_2a0,"\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\n");
              bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
              if (bVar17) {
                ctemplate::TemplateString::TemplateString(&local_2d0,"hardest double");
                ctemplate::TemplateString::TemplateString
                          (&local_2a0,
                           "print \\x22\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\x22;\\r\\n\\\\1;");
                bVar17 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_2d0,&local_2a0);
                if (bVar17) {
                  ctemplate::TemplateModifier::~TemplateModifier
                            (&double_escaper.super_TemplateModifier);
                  ctemplate::TemplateModifier::~TemplateModifier
                            (&foo_escaper.super_TemplateModifier);
                  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                  return;
                }
                pcVar18 = 
                "peer.ValueIs(\"hardest double\", \"print \\\\x22\\\\x3cA HREF\\\\x3d\\\\x27foo\\\\x27\\\\x3e\\\\x22;\" \"\\\\r\\\\n\\\\\\\\1;\")"
                ;
              }
              else {
                pcVar18 = 
                "peer.ValueIs(\"harder double\", \"\\\\x3cA HREF\\\\x3d\\\\x27foo\\\\x27\\\\x3e\\\\n\")"
                ;
              }
            }
            else {
              pcVar18 = "peer.ValueIs(\"easy double\", \"doo\")";
            }
          }
          else {
            pcVar18 = "peer.ValueIs(\"harder foo\", \"foo\")";
          }
        }
        else {
          pcVar18 = "peer.ValueIs(\"easy foo\", \"foo\")";
        }
      }
      else {
        pcVar18 = "peer.ValueIs(\"query escape 0\", \"\")";
      }
    }
    else {
      pcVar18 = 
      "peer.ValueIs(\"hardest JS\", \"f \\\\x3d \\\\x27foo\\\\x27;\\\\r\\\\n\\\\tprint \\\\x22\\\\\\\\\\\\x26\" \"foo \\\\x3d \\\\b\\\\x22, \\\\x22foo\\\\x22\")"
      ;
    }
  }
  else {
    pcVar18 = 
    "peer.ValueIs(\"hardest HTML\", \"&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; \" \"baz&quot;&gt;\")"
    ;
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar18);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetEscapedValue) {
  TemplateDictionary dict("test_SetEscapedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetEscapedValue("hardest HTML",
                       "<A HREF='foo'\nid=\"bar\t\t&&\vbaz\">",
                       GOOGLE_NAMESPACE::html_escape);
  dict.SetEscapedValue("hardest JS",
                       ("f = 'foo';\r\n\tprint \"\\&foo = \b\", \"foo\""),
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("query escape 0", "",
                       GOOGLE_NAMESPACE::url_query_escape);

  EXPECT_TRUE(peer.ValueIs("hardest HTML",
                           "&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; "
                           "baz&quot;&gt;"));
  EXPECT_TRUE(peer.ValueIs("hardest JS",
                           "f \\x3d \\x27foo\\x27;\\r\\n\\tprint \\x22\\\\\\x26"
                           "foo \\x3d \\b\\x22, \\x22foo\\x22"));
  EXPECT_TRUE(peer.ValueIs("query escape 0", ""));

  // Test using hand-made modifiers.
  FooEscaper foo_escaper;
  dict.SetEscapedValue("easy foo", "hello there!",
                       FooEscaper());
  dict.SetEscapedValue("harder foo", "so much to say\nso many foos",
                       foo_escaper);
  DoubleEscaper double_escaper;
  dict.SetEscapedValue("easy double", "doo",
                       double_escaper);
  dict.SetEscapedValue("harder double", "<A HREF='foo'>\n",
                       DoubleEscaper());
  dict.SetEscapedValue("hardest double",
                       "print \"<A HREF='foo'>\";\r\n\\1;",
                       double_escaper);

  EXPECT_TRUE(peer.ValueIs("easy foo", "foo"));
  EXPECT_TRUE(peer.ValueIs("harder foo", "foo"));
  EXPECT_TRUE(peer.ValueIs("easy double", "doo"));
  EXPECT_TRUE(peer.ValueIs("harder double",
                           "\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\n"));
  EXPECT_TRUE(peer.ValueIs("hardest double",
                           "print \\x22\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\x22;"
                           "\\r\\n\\\\1;"));
}